

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

int op_mem_read(void *_stream,uchar *_ptr,int _buf_size)

{
  long lVar1;
  long lVar2;
  int local_48;
  ptrdiff_t pos;
  ptrdiff_t size;
  OpusMemStream *stream;
  int _buf_size_local;
  uchar *_ptr_local;
  void *_stream_local;
  
  if (_buf_size < 1) {
    _stream_local._4_4_ = 0;
  }
  else {
    lVar1 = *(long *)((long)_stream + 8);
    lVar2 = *(long *)((long)_stream + 0x10);
    if (lVar2 < lVar1) {
      local_48 = _buf_size;
      if (lVar1 - lVar2 < (long)_buf_size) {
        local_48 = (int)lVar1 - (int)lVar2;
      }
      _stream_local._4_4_ = local_48;
      memcpy(_ptr,(void *)(*_stream + lVar2),(long)local_48);
      *(long *)((long)_stream + 0x10) = local_48 + lVar2;
    }
    else {
      _stream_local._4_4_ = 0;
    }
  }
  return _stream_local._4_4_;
}

Assistant:

static int op_mem_read(void *_stream,unsigned char *_ptr,int _buf_size){
  OpusMemStream *stream;
  ptrdiff_t      size;
  ptrdiff_t      pos;
  stream=(OpusMemStream *)_stream;
  /*Check for empty read.*/
  if(_buf_size<=0)return 0;
  size=stream->size;
  pos=stream->pos;
  /*Check for EOF.*/
  if(pos>=size)return 0;
  /*Check for a short read.*/
  _buf_size=(int)OP_MIN(size-pos,_buf_size);
  memcpy(_ptr,stream->data+pos,_buf_size);
  pos+=_buf_size;
  stream->pos=pos;
  return _buf_size;
}